

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O0

t_object * __thiscall
xemmai::t_heap<xemmai::t_object>::f_allocate_large(t_heap<xemmai::t_object> *this,size_t a_size)

{
  t_object *this_00;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  t_object *p;
  size_t a_size_local;
  t_heap<xemmai::t_object> *this_local;
  
  p = (t_object *)a_size;
  a_size_local = (size_t)this;
  this_00 = (t_object *)f_map(a_size);
  t_object::t_object(this_00);
  this_00->v_rank = 0x39;
  lock._M_device = (mutex_type *)this_00;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(this + 0x38));
  std::
  map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
  ::emplace<xemmai::t_object*&,unsigned_long&>
            ((map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>
              *)(this + 8),(t_object **)&lock,(unsigned_long *)&p);
  *(long *)(this + 0x128) = *(long *)(this + 0x128) + 1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return (t_object *)lock._M_device;
}

Assistant:

T* t_heap<T>::f_allocate_large(size_t a_size)
{
	auto p = new(f_map(a_size)) T;
	p->v_rank = c_RANKX;
	{
		std::lock_guard lock(v_mutex);
		v_blocks.emplace(p, a_size);
		++v_allocated;
	}
	return p;
}